

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtl_hv.c
# Opt level: O1

dtl_hv_t * dtl_hv_new(void)

{
  dtl_hv_t *__ptr;
  adt_hash_t *paVar1;
  
  __ptr = (dtl_hv_t *)malloc(0x10);
  if (__ptr != (dtl_hv_t *)0x0) {
    paVar1 = (adt_hash_t *)malloc(0x50);
    __ptr->pAny = paVar1;
    if (paVar1 != (adt_hash_t *)0x0) {
      adt_hash_create(paVar1,dtl_dv_dec_ref_void);
      __ptr->u32RefCnt = 1;
      __ptr->u32Flags = 4;
      return __ptr;
    }
    free(__ptr);
  }
  return (dtl_hv_t *)0x0;
}

Assistant:

dtl_hv_t* dtl_hv_new(void)
{
	dtl_hv_t *self;
	if( (self = (dtl_hv_t*) malloc(sizeof(dtl_hv_t))) == (dtl_hv_t*) 0 )
	{
		return (dtl_hv_t*) 0;
	}
	if( (self->pAny = (adt_hash_t*) malloc(sizeof(adt_hash_t))) == (adt_hash_t*) 0 )
	{
		free(self);
		return (dtl_hv_t*)0;
	}
	dtl_hv_create(self);
	return self;
}